

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

uint64_t recip_sqrt_estimate(int *exp,int exp_off,uint64_t frac)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = *exp;
  if (uVar3 == 0) {
    uVar3 = 0;
    while (uVar1 = frac >> 0x33, frac = frac * 2, (uVar1 & 1) == 0) {
      uVar3 = uVar3 - 1;
      *exp = uVar3;
    }
  }
  iVar2 = (uint)((uVar3 & 1) == 0) * 0x80;
  uVar3 = do_recip_sqrt_estimate
                    (iVar2 + ((uint)(frac >> ((byte)(uVar3 & 1) | 0x2c)) & iVar2 + 0x7fU) + 0x80);
  *exp = (exp_off - *exp) / 2;
  return (ulong)(uVar3 & 0xff) << 0x2c;
}

Assistant:

static uint64_t recip_sqrt_estimate(int *exp , int exp_off, uint64_t frac)
{
    int estimate;
    uint32_t scaled;

    if (*exp == 0) {
        while (extract64(frac, 51, 1) == 0) {
            frac = frac << 1;
            *exp -= 1;
        }
        frac = extract64(frac, 0, 51) << 1;
    }

    if (*exp & 1) {
        /* scaled = UInt('01':fraction<51:45>) */
        scaled = deposit32(1 << 7, 0, 7, extract64(frac, 45, 7));
    } else {
        /* scaled = UInt('1':fraction<51:44>) */
        scaled = deposit32(1 << 8, 0, 8, extract64(frac, 44, 8));
    }
    estimate = do_recip_sqrt_estimate(scaled);

    *exp = (exp_off - *exp) / 2;
    return extract64(estimate, 0, 8) << 44;
}